

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

bool am_remove_match_command(Am_Object *match_command)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Object installed_on_command;
  Am_Object_Method do_method;
  Am_Object local_20;
  Am_Object_Method local_18;
  
  pAVar1 = Am_Object::Get(match_command,Am_INSTALLED_ON_COMMAND,0);
  Am_Object::Am_Object(&local_20,pAVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*Removing match_command ",0x18);
  poVar2 = operator<<((ostream *)&std::cout,match_command);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," for ",5);
  poVar2 = operator<<(poVar2,&local_20);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ostream::flush();
  pAVar1 = Am_Object::Get(&local_20,Am_REAL_DO_METHOD,3);
  Am_Object_Method::Am_Object_Method(&local_18,pAVar1);
  Am_Object::Set(&local_20,0xca,local_18.from_wrapper,0);
  Am_Object::Set(&local_20,Am_INVOKE_MATCH_COMMAND,0,0);
  Am_Object::~Am_Object(&local_20);
  return true;
}

Assistant:

bool
am_remove_match_command(Am_Object &match_command)
{
  Am_Object installed_on_command = match_command.Get(Am_INSTALLED_ON_COMMAND);
  std::cout << "*Removing match_command " << match_command << " for "
            << installed_on_command << std::endl
            << std::flush;
  Am_Object_Method do_method =
      installed_on_command.Get(Am_REAL_DO_METHOD, Am_RETURN_ZERO_ON_ERROR);
  installed_on_command.Set(Am_DO_METHOD, do_method);
  installed_on_command.Set(Am_INVOKE_MATCH_COMMAND, (0L));
  return true;
}